

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O1

int __thiscall zmq::zmtp_engine_t::produce_ping_message(zmtp_engine_t *this,msg_t *msg_)

{
  ushort uVar1;
  mechanism_t *pmVar2;
  int iVar3;
  undefined4 *puVar4;
  void *pvVar5;
  
  if ((this->super_stream_engine_base_t)._mechanism == (mechanism_t *)0x0) {
    produce_ping_message();
  }
  iVar3 = msg_t::init_size(msg_,7);
  if (iVar3 != 0) {
    produce_ping_message();
  }
  msg_t::set_flags(msg_,'\x02');
  puVar4 = (undefined4 *)msg_t::data(msg_);
  *puVar4 = 0x4e495004;
  *(undefined1 *)(puVar4 + 1) = 0x47;
  uVar1 = (this->super_stream_engine_base_t)._options.heartbeat_ttl;
  pvVar5 = msg_t::data(msg_);
  *(ushort *)((long)pvVar5 + 5) = uVar1 << 8 | uVar1 >> 8;
  pmVar2 = (this->super_stream_engine_base_t)._mechanism;
  iVar3 = (*pmVar2->_vptr_mechanism_t[4])(pmVar2,msg_);
  (this->super_stream_engine_base_t)._next_msg =
       (offset_in_stream_engine_base_t_to_subr)stream_engine_base_t::pull_and_encode;
  *(undefined8 *)&(this->super_stream_engine_base_t).field_0x550 = 0;
  if (((this->super_stream_engine_base_t)._has_timeout_timer == false) &&
     (0 < this->_heartbeat_timeout)) {
    io_object_t::add_timer((io_object_t *)this,this->_heartbeat_timeout,0x81);
    (this->super_stream_engine_base_t)._has_timeout_timer = true;
  }
  return iVar3;
}

Assistant:

int zmq::zmtp_engine_t::produce_ping_message (msg_t *msg_)
{
    // 16-bit TTL + \4PING == 7
    const size_t ping_ttl_len = msg_t::ping_cmd_name_size + 2;
    zmq_assert (_mechanism != NULL);

    int rc = msg_->init_size (ping_ttl_len);
    errno_assert (rc == 0);
    msg_->set_flags (msg_t::command);
    // Copy in the command message
    memcpy (msg_->data (), "\4PING", msg_t::ping_cmd_name_size);

    uint16_t ttl_val = htons (_options.heartbeat_ttl);
    memcpy (static_cast<uint8_t *> (msg_->data ()) + msg_t::ping_cmd_name_size,
            &ttl_val, sizeof (ttl_val));

    rc = _mechanism->encode (msg_);
    _next_msg = &zmtp_engine_t::pull_and_encode;
    if (!_has_timeout_timer && _heartbeat_timeout > 0) {
        add_timer (_heartbeat_timeout, heartbeat_timeout_timer_id);
        _has_timeout_timer = true;
    }
    return rc;
}